

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaSetAllocatedAcrossArenasWithReflection_Test::TestBody
          (ArenaTest_UnsafeArenaSetAllocatedAcrossArenasWithReflection_Test *this)

{
  TestAllTypes *pTVar1;
  Reflection *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  char *pcVar2;
  string_view name;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  NestedMessage *arena2_submessage;
  AssertHelper local_180;
  NestedMessage *arena1_submessage;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_170;
  Arena arena2;
  Arena arena1;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena1.impl_);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&arena1.impl_);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  this_01 = proto2_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "optional_nested_message";
  name._M_len = 0x17;
  field = Descriptor::FindFieldByName(this_01,name);
  internal::ThreadSafeArena::ThreadSafeArena(&arena2.impl_);
  arena2_submessage =
       (NestedMessage *)
       Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(&arena2);
  *(undefined4 *)((long)&arena2_submessage->field_0 + 8) = 0x2a;
  *(byte *)&arena2_submessage->field_0 = *(byte *)&arena2_submessage->field_0 | 1;
  Reflection::UnsafeArenaSetAllocatedMessage
            (this_00,(Message *)pTVar1,(Message *)arena2_submessage,field);
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       proto2_unittest::TestAllTypes::mutable_optional_nested_message(pTVar1);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&arena1_submessage,"arena2_submessage",
             "arena1_message->mutable_optional_nested_message()",&arena2_submessage,
             (TestAllTypes_NestedMessage **)&local_190);
  if ((char)arena1_submessage == '\0') {
    testing::Message::Message((Message *)&local_190);
    if (local_170._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = ((local_170._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x404,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((TestAllTypes_NestedMessage *)local_190._M_head_impl != (TestAllTypes_NestedMessage *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_170);
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 & 0xdf;
  local_190._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)&pTVar1->field_0 + 0x210);
  (pTVar1->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&arena1_submessage,"arena2_submessage",
             "arena1_message->unsafe_arena_release_optional_nested_message()",&arena2_submessage,
             (TestAllTypes_NestedMessage **)&local_190);
  if ((char)arena1_submessage == '\0') {
    testing::Message::Message((Message *)&local_190);
    if (local_170._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = ((local_170._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x406,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_170);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena2.impl_);
  arena1_submessage =
       (NestedMessage *)
       Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(&arena1);
  (arena1_submessage->field_0)._impl_.bb_ = 0x2a;
  *(byte *)&arena1_submessage->field_0 = *(byte *)&arena1_submessage->field_0 | 1;
  pTVar1 = (TestAllTypes *)operator_new(0x340);
  proto2_unittest::TestAllTypes::TestAllTypes(pTVar1);
  Reflection::UnsafeArenaSetAllocatedMessage
            (this_00,(Message *)pTVar1,&arena1_submessage->super_Message,field);
  arena2_submessage = proto2_unittest::TestAllTypes::mutable_optional_nested_message(pTVar1);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&arena2,"arena1_submessage",
             "heap_message->mutable_optional_nested_message()",&arena1_submessage,&arena2_submessage
            );
  if ((char)arena2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&arena2_submessage);
    if (arena2.impl_.alloc_policy_.policy_ == 0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)arena2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x40e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_190,(Message *)&arena2_submessage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (arena2_submessage != (NestedMessage *)0x0) {
      (*(arena2_submessage->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena2.impl_.alloc_policy_);
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 & 0xdf;
  arena2_submessage = (pTVar1->field_0)._impl_.optional_nested_message_;
  (pTVar1->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            ((internal *)&arena2,"arena1_submessage",
             "heap_message->unsafe_arena_release_optional_nested_message()",&arena1_submessage,
             &arena2_submessage);
  if ((char)arena2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&arena2_submessage);
    if (arena2.impl_.alloc_policy_.policy_ == 0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)arena2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x410,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_190,(Message *)&arena2_submessage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (arena2_submessage != (NestedMessage *)0x0) {
      (*(arena2_submessage->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena2.impl_.alloc_policy_);
  proto2_unittest::TestAllTypes::~TestAllTypes(pTVar1);
  operator_delete(pTVar1,0x340);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena1.impl_);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaSetAllocatedAcrossArenasWithReflection) {
  // Same as above, with reflection.
  Arena arena1;
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  const Reflection* r = arena1_message->GetReflection();
  const Descriptor* d = arena1_message->GetDescriptor();
  const FieldDescriptor* msg_field =
      d->FindFieldByName("optional_nested_message");
  {
    Arena arena2;
    TestAllTypes::NestedMessage* arena2_submessage =
        Arena::Create<TestAllTypes::NestedMessage>(&arena2);
    arena2_submessage->set_bb(42);
    r->UnsafeArenaSetAllocatedMessage(arena1_message, arena2_submessage,
                                      msg_field);
    EXPECT_EQ(arena2_submessage,
              arena1_message->mutable_optional_nested_message());
    EXPECT_EQ(arena2_submessage,
              arena1_message->unsafe_arena_release_optional_nested_message());
  }

  TestAllTypes::NestedMessage* arena1_submessage =
      Arena::Create<TestAllTypes::NestedMessage>(&arena1);
  arena1_submessage->set_bb(42);
  TestAllTypes* heap_message = new TestAllTypes;
  r->UnsafeArenaSetAllocatedMessage(heap_message, arena1_submessage, msg_field);
  EXPECT_EQ(arena1_submessage, heap_message->mutable_optional_nested_message());
  EXPECT_EQ(arena1_submessage,
            heap_message->unsafe_arena_release_optional_nested_message());
  delete heap_message;
}